

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O2

vector<Mirror,_std::allocator<Mirror>_> * __thiscall
Mems::get_mirror_cluster
          (vector<Mirror,_std::allocator<Mirror>_> *__return_storage_ptr__,Mems *this,
          Point_d *displayed_sample)

{
  ostream *poVar1;
  pointer __x;
  double dVar2;
  double dVar3;
  
  (__return_storage_ptr__->super__Vector_base<Mirror,_std::allocator<Mirror>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Mirror,_std::allocator<Mirror>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Mirror,_std::allocator<Mirror>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (__x = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
             super__Vector_impl_data._M_start;
      __x != (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
             super__Vector_impl_data._M_finish; __x = __x + 1) {
    dVar2 = displayed_sample->x - (__x->_position).x;
    dVar3 = displayed_sample->y - (__x->_position).y;
    if (dVar3 * dVar3 + dVar2 * dVar2 <= this->max_sample_dis) {
      std::vector<Mirror,_std::allocator<Mirror>_>::push_back(__return_storage_ptr__,__x);
    }
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"created mirrorcluster for mirror with size: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  return __return_storage_ptr__;
}

Assistant:

std::vector<Mirror> Mems::get_mirror_cluster(Point_d const& displayed_sample){

  std::vector<Mirror> m_cluster;
  for(auto it = std::begin(_mems_mirrors); it != std::end(_mems_mirrors); it++)
    {
      double dis_x = displayed_sample.x - it->_position.x;
      double dis_y = displayed_sample.y - it->_position.y;
      double sample_dis = pow(dis_x , 2)+pow(dis_y , 2);
              if(sample_dis<=max_sample_dis)
                {
                  m_cluster.push_back(*it);
                }
    }
    std::cout<<"created mirrorcluster for mirror with size: "<< m_cluster.size()<< "\n";
    return m_cluster;
  }